

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateClearFunctionImplementation
          (OneofGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message) {\n  GPBDescriptor *descriptor = [message descriptor];\n  GPBOneofDescriptor *oneof = [descriptor.oneofs objectAtIndex:$raw_index$];\n  GPBMaybeClearOneof(message, oneof, $index$, 0);\n}\n"
                    );
  return;
}

Assistant:

void OneofGenerator::GenerateClearFunctionImplementation(io::Printer* printer) {
  printer->Print(
      variables_,
      "void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message) {\n"
      "  GPBDescriptor *descriptor = [message descriptor];\n"
      "  GPBOneofDescriptor *oneof = [descriptor.oneofs objectAtIndex:$raw_index$];\n"
      "  GPBMaybeClearOneof(message, oneof, $index$, 0);\n"
      "}\n");
}